

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase80::run(TestCase80 *this)

{
  void *pvVar1;
  DebugComparison<int_*,_int_*> _kjCondition;
  int *local_38;
  int *local_30;
  Arena arena;
  
  Arena::Arena(&arena,0x400);
  pvVar1 = Arena::allocateBytes(&arena,4,4,false);
  _kjCondition.right = (int *)Arena::allocateBytes(&arena,4,4,false);
  _kjCondition.left = (int *)((long)pvVar1 + 4);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == _kjCondition.right;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_38 = _kjCondition.right;
    local_30 = _kjCondition.left;
    kj::_::Debug::log<char_const(&)[36],kj::_::DebugComparison<int*,int*>&,int*,int*>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena-test.c++"
               ,0x57,ERROR,
               "\"failed: expected \" \"(&i1 + 1) == (&i2)\", _kjCondition, &i1 + 1, &i2",
               (char (*) [36])"failed: expected (&i1 + 1) == (&i2)",&_kjCondition,&local_30,
               &local_38);
  }
  Arena::~Arena(&arena);
  return;
}

Assistant:

TEST(Arena, TrivialObject) {
  Arena arena;

  int& i1 = arena.allocate<int>();
  int& i2 = arena.allocate<int>();

  // Trivial objects should be tightly-packed.
  EXPECT_EQ(&i1 + 1, &i2);
}